

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Layer * __thiscall ncnn::Net::create_overwrite_builtin_layer(Net *this,int typeindex)

{
  layer_creator_func p_Var1;
  size_type sVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  Layer *layer;
  layer_creator_func layer_creator;
  size_t i;
  size_t overwrite_builtin_layer_registry_entry_count;
  int index;
  size_type local_28;
  int local_18;
  Layer *local_8;
  
  local_18 = -1;
  sVar2 = std::
          vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
          ::size((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                  *)(*(long *)(in_RDI + 0x48) + 0xb0));
  local_28 = 0;
  do {
    if (sVar2 <= local_28) {
LAB_00207978:
      if (local_18 == -1) {
        local_8 = (Layer *)0x0;
      }
      else {
        pvVar3 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0xb0),(long)local_18);
        p_Var1 = pvVar3->creator;
        if (p_Var1 == (layer_creator_func)0x0) {
          local_8 = (Layer *)0x0;
        }
        else {
          pvVar3 = std::
                   vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                   ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                                 *)(*(long *)(in_RDI + 0x48) + 0xb0),(long)local_18);
          local_8 = (*p_Var1)(pvVar3->userdata);
          local_8->typeindex = in_ESI;
        }
      }
      return local_8;
    }
    pvVar3 = std::
             vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
             ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0xb0),local_28);
    if (pvVar3->typeindex == in_ESI) {
      local_18 = (int)local_28;
      goto LAB_00207978;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Layer* Net::create_overwrite_builtin_layer(int typeindex)
{
    int index = -1;
    const size_t overwrite_builtin_layer_registry_entry_count = d->overwrite_builtin_layer_registry.size();
    for (size_t i = 0; i < overwrite_builtin_layer_registry_entry_count; i++)
    {
        if (d->overwrite_builtin_layer_registry[i].typeindex == typeindex)
        {
            index = i;
            break;
        }
    }

    if (index == -1)
        return 0;

    layer_creator_func layer_creator = d->overwrite_builtin_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(d->overwrite_builtin_layer_registry[index].userdata);
    layer->typeindex = typeindex;
    return layer;
}